

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O2

float_t __thiscall djb::microfacet::sigma(microfacet *this,vec3 *wi,args *args)

{
  float b;
  float extraout_XMM0_Da;
  vec3 local_18;
  
  local_18 = djb::operator*(&args->minv,wi);
  b = SQRT(local_18.z * local_18.z + local_18.x * local_18.x + local_18.y * local_18.y);
  operator/(&local_18,b);
  (*(this->super_brdf)._vptr_brdf[10])(this);
  return extraout_XMM0_Da * b;
}

Assistant:

float_t microfacet::sigma(const vec3 &wi, const args &args) const
{
	vec3 wi_std = args.minv * wi;
	float_t nrm = sqrt(dot(wi_std, wi_std));
	return sigma_std(wi_std / nrm) * nrm;
}